

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_trainer.cc
# Opt level: O0

string * __thiscall
sentencepiece::SentencePieceNormalizer::Normalize_abi_cxx11_
          (string *__return_storage_ptr__,SentencePieceNormalizer *this,string_view input)

{
  Status local_38 [15];
  undefined1 local_29;
  SentencePieceNormalizer *local_28;
  SentencePieceNormalizer *this_local;
  string_view input_local;
  string *normalized;
  
  input_local._M_len = (size_t)input._M_str;
  this_local = (SentencePieceNormalizer *)input._M_len;
  local_29 = 0;
  local_28 = this;
  input_local._M_str = (char *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  (*this->_vptr_SentencePieceNormalizer[7])
            (local_38,this,this_local,input_local._M_len,__return_storage_ptr__);
  sentencepiece::util::Status::IgnoreError();
  sentencepiece::util::Status::~Status(local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string SentencePieceNormalizer::Normalize(absl::string_view input) const {
  std::string normalized;
  Normalize(input, &normalized).IgnoreError();
  return normalized;
}